

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

string * __thiscall
pbrt::syntactic::ParamArray<pbrt::syntactic::Texture>::toString_abi_cxx11_
          (string *__return_storage_ptr__,ParamArray<pbrt::syntactic::Texture> *this)

{
  ostream *poVar1;
  stringstream ss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  (**(this->super_Param)._vptr_Param)(asStack_1b8,this);
  poVar1 = std::operator<<(local_188,asStack_1b8);
  std::operator<<(poVar1," ");
  std::__cxx11::string::~string(asStack_1b8);
  std::operator<<(local_188,"[ ");
  std::operator<<(local_188,"<TODO>");
  std::operator<<(local_188,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string ParamArray<Texture>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      ss << "<TODO>";
      ss << "]";
      return ss.str();
    }